

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O2

void despot::DESPOT::ExploitBlockers(VNode *vnode)

{
  VNode *vnode_00;
  VNode *pVVar1;
  QNode *pQVar2;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *pmVar3;
  _Base_ptr p_Var4;
  _Self __tmp;
  double dVar5;
  ValuedAction VVar6;
  
  if (0.0 < DAT_0019fde0) {
    while ((vnode_00 = vnode, vnode_00 != (VNode *)0x0 &&
           (pVVar1 = FindBlocker(vnode_00), pVVar1 != (VNode *)0x0))) {
      pQVar2 = VNode::parent(vnode_00);
      if ((pVVar1 == vnode_00) || (pQVar2 == (QNode *)0x0)) {
        VVar6 = VNode::default_move(vnode_00);
        dVar5 = VVar6.value;
        VNode::lower_bound(vnode_00,dVar5);
        VNode::upper_bound(vnode_00,dVar5);
        vnode_00->utility_upper_bound = dVar5;
      }
      else {
        pQVar2 = VNode::parent(vnode_00);
        pmVar3 = QNode::children(pQVar2);
        for (p_Var4 = (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var4 != &(pmVar3->_M_t)._M_impl.super__Rb_tree_header;
            p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
          pVVar1 = (VNode *)p_Var4[1]._M_parent;
          VVar6 = VNode::default_move(pVVar1);
          dVar5 = VVar6.value;
          VNode::lower_bound(pVVar1,dVar5);
          VNode::upper_bound(pVVar1,dVar5);
          pVVar1->utility_upper_bound = dVar5;
        }
      }
      Backup(vnode_00);
      pQVar2 = VNode::parent(vnode_00);
      vnode = (VNode *)0x0;
      if (pQVar2 != (QNode *)0x0) {
        pQVar2 = VNode::parent(vnode_00);
        vnode = QNode::parent(pQVar2);
      }
    }
  }
  return;
}

Assistant:

void DESPOT::ExploitBlockers(VNode* vnode) {
	if (Globals::config.pruning_constant <= 0) {
		return;
	}

	VNode* cur = vnode;
	while (cur != NULL) {
		VNode* blocker = FindBlocker(cur);

		if (blocker != NULL) {
			if (cur->parent() == NULL || blocker == cur) {
				double value = cur->default_move().value;
				cur->lower_bound(value);
				cur->upper_bound(value);
				cur->utility_upper_bound = value;
			} else {
				const map<OBS_TYPE, VNode*>& siblings =
					cur->parent()->children();
				for (map<OBS_TYPE, VNode*>::const_iterator it = siblings.begin();
					it != siblings.end(); it++) {
					VNode* node = it->second;
					double value = node->default_move().value;
					node->lower_bound(value);
					node->upper_bound(value);
					node->utility_upper_bound = value;
				}
			}

			Backup(cur);

			if (cur->parent() == NULL) {
				cur = NULL;
			} else {
				cur = cur->parent()->parent();
			}
		} else {
			break;
		}
	}
}